

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool tdefl_compress_lz_codes(tdefl_compressor *d)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  byte *pbVar4;
  mz_uint8 *pmVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  byte *pbVar12;
  byte *pbVar13;
  uint local_88;
  uint local_84;
  uint local_80;
  mz_uint len_1;
  mz_uint bits_1;
  mz_uint len;
  mz_uint bits;
  mz_uint32 n;
  mz_uint lit;
  mz_uint match_dist;
  mz_uint match_len;
  mz_uint num_extra_bits;
  mz_uint sym;
  mz_uint n1;
  mz_uint n0;
  mz_uint s1;
  mz_uint s0;
  mz_uint bits_in;
  mz_uint64 bit_buffer;
  mz_uint8 *pLZ_code_buf_end;
  mz_uint8 *pOutput_buf;
  mz_uint8 *pLZ_codes;
  mz_uint flags;
  tdefl_compressor *d_local;
  
  pLZ_code_buf_end = d->m_pOutput_buf;
  pbVar4 = d->m_pLZ_code_buf;
  _s0 = (ulong)d->m_bit_buffer;
  s1 = d->m_bits_in;
  pLZ_codes._4_4_ = 1;
  pOutput_buf = d->m_lz_code_buf;
  do {
    if (pbVar4 <= pOutput_buf) {
      d->m_pOutput_buf = pLZ_code_buf_end;
      d->m_bits_in = 0;
      d->m_bit_buffer = 0;
      while( true ) {
        if (s1 == 0) {
          uVar11 = (uint)d->m_huff_codes[0][0x100];
          bVar1 = d->m_huff_code_sizes[0][0x100];
          if (uVar11 <= (1 << (bVar1 & 0x1f)) - 1U) {
            d->m_bit_buffer = uVar11 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
            d->m_bits_in = (uint)bVar1 + d->m_bits_in;
            while (7 < d->m_bits_in) {
              if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
                pmVar5 = d->m_pOutput_buf;
                d->m_pOutput_buf = pmVar5 + 1;
                *pmVar5 = (mz_uint8)d->m_bit_buffer;
              }
              d->m_bit_buffer = d->m_bit_buffer >> 8;
              d->m_bits_in = d->m_bits_in - 8;
            }
            return (uint)(d->m_pOutput_buf < d->m_pOutput_buf_end);
          }
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                        ,0x478,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
        }
        if (s1 < 0x10) {
          local_88 = s1;
        }
        else {
          local_88 = 0x10;
        }
        uVar11 = (uint)_s0 & mz_bitmasks[local_88];
        if ((1 << ((byte)local_88 & 0x1f)) - 1U < uVar11) break;
        d->m_bit_buffer = uVar11 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
        d->m_bits_in = local_88 + d->m_bits_in;
        while (7 < d->m_bits_in) {
          if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
            pmVar5 = d->m_pOutput_buf;
            d->m_pOutput_buf = pmVar5 + 1;
            *pmVar5 = (mz_uint8)d->m_bit_buffer;
          }
          d->m_bit_buffer = d->m_bit_buffer >> 8;
          d->m_bits_in = d->m_bits_in - 8;
        }
        _s0 = _s0 >> ((byte)local_88 & 0x3f);
        s1 = s1 - local_88;
      }
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                    ,0x473,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
    }
    if (pLZ_codes._4_4_ == 1) {
      pLZ_codes._4_4_ = *pOutput_buf | 0x100;
      pOutput_buf = pOutput_buf + 1;
    }
    uVar11 = pLZ_codes._4_4_;
    if ((pLZ_codes._4_4_ & 1) == 0) {
      pbVar12 = pOutput_buf + 1;
      uVar6 = (uint)*pOutput_buf;
      if (d->m_huff_code_sizes[0][uVar6] == '\0') {
        __assert_fail("d->m_huff_code_sizes[0][lit]",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                      ,0x44d,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      _s0 = (ulong)d->m_huff_codes[0][uVar6] << ((byte)s1 & 0x3f) | _s0;
      s1 = d->m_huff_code_sizes[0][uVar6] + s1;
      if (((pLZ_codes._4_4_ & 2) == 0) && (pbVar12 < pbVar4)) {
        uVar11 = pLZ_codes._4_4_ >> 1;
        pbVar13 = pOutput_buf + 2;
        uVar6 = (uint)*pbVar12;
        if (d->m_huff_code_sizes[0][uVar6] == '\0') {
          __assert_fail("d->m_huff_code_sizes[0][lit]",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                        ,0x454,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
        }
        _s0 = (ulong)d->m_huff_codes[0][uVar6] << ((byte)s1 & 0x3f) | _s0;
        s1 = d->m_huff_code_sizes[0][uVar6] + s1;
        pbVar12 = pbVar13;
        if (((uVar11 & 2) == 0) && (pbVar13 < pbVar4)) {
          uVar11 = (uint)*pbVar13;
          if (d->m_huff_code_sizes[0][uVar11] == '\0') {
            __assert_fail("d->m_huff_code_sizes[0][lit]",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                          ,0x45b,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
          }
          _s0 = (ulong)d->m_huff_codes[0][uVar11] << ((byte)s1 & 0x3f) | _s0;
          s1 = d->m_huff_code_sizes[0][uVar11] + s1;
          pbVar12 = pOutput_buf + 3;
          uVar11 = pLZ_codes._4_4_ >> 2;
        }
      }
    }
    else {
      uVar6 = (uint)*pOutput_buf;
      uVar3 = *(ushort *)(pOutput_buf + 1);
      uVar7 = (uint)uVar3;
      if (d->m_huff_code_sizes[0][s_tdefl_len_sym[uVar6]] == '\0') {
        __assert_fail("d->m_huff_code_sizes[0][s_tdefl_len_sym[match_len]]",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                      ,0x43a,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      iVar8 = d->m_huff_code_sizes[0][s_tdefl_len_sym[uVar6]] + s1;
      iVar9 = (uint)""[uVar6] + iVar8;
      bVar1 = ""[uVar3 >> 8];
      bVar2 = ""[uVar3 >> 8];
      if (uVar7 < 0x200) {
        bVar1 = ""[uVar7 & 0x1ff];
      }
      local_80 = (uint)bVar1;
      if (uVar7 < 0x200) {
        bVar2 = ""[uVar7 & 0x1ff];
      }
      local_84 = (uint)bVar2;
      if (d->m_huff_code_sizes[1][local_80] == '\0') {
        __assert_fail("d->m_huff_code_sizes[1][sym]",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                      ,0x446,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      iVar10 = (uint)d->m_huff_code_sizes[1][local_80] + iVar9;
      _s0 = (ulong)(uVar7 & mz_bitmasks[local_84]) << ((byte)iVar10 & 0x3f) |
            (ulong)d->m_huff_codes[1][local_80] << ((byte)iVar9 & 0x3f) |
            (ulong)(uVar6 & mz_bitmasks[""[uVar6]]) << ((byte)iVar8 & 0x3f) |
            (ulong)d->m_huff_codes[0][s_tdefl_len_sym[uVar6]] << ((byte)s1 & 0x3f) | _s0;
      s1 = local_84 + iVar10;
      pbVar12 = pOutput_buf + 3;
    }
    pLZ_codes._4_4_ = uVar11;
    pOutput_buf = pbVar12;
    if (d->m_pOutput_buf_end <= pLZ_code_buf_end) {
      return 0;
    }
    *(ulong *)pLZ_code_buf_end = _s0;
    pLZ_code_buf_end = pLZ_code_buf_end + (s1 >> 3);
    _s0 = _s0 >> ((byte)s1 & 0x38);
    s1 = s1 & 7;
    pLZ_codes._4_4_ = pLZ_codes._4_4_ >> 1;
  } while( true );
}

Assistant:

static mz_bool tdefl_compress_lz_codes(tdefl_compressor *d)
{
    mz_uint flags;
    mz_uint8 *pLZ_codes;
    mz_uint8 *pOutput_buf = d->m_pOutput_buf;
    mz_uint8 *pLZ_code_buf_end = d->m_pLZ_code_buf;
    mz_uint64 bit_buffer = d->m_bit_buffer;
    mz_uint bits_in = d->m_bits_in;

#define TDEFL_PUT_BITS_FAST(b, l)                    \
    {                                                \
        bit_buffer |= (((mz_uint64)(b)) << bits_in); \
        bits_in += (l);                              \
    }

    flags = 1;
    for (pLZ_codes = d->m_lz_code_buf; pLZ_codes < pLZ_code_buf_end; flags >>= 1)
    {
        if (flags == 1)
            flags = *pLZ_codes++ | 0x100;

        if (flags & 1)
        {
            mz_uint s0, s1, n0, n1, sym, num_extra_bits;
            mz_uint match_len = pLZ_codes[0], match_dist = *(const mz_uint16 *)(pLZ_codes + 1);
            pLZ_codes += 3;

            MZ_ASSERT(d->m_huff_code_sizes[0][s_tdefl_len_sym[match_len]]);
            TDEFL_PUT_BITS_FAST(d->m_huff_codes[0][s_tdefl_len_sym[match_len]], d->m_huff_code_sizes[0][s_tdefl_len_sym[match_len]]);
            TDEFL_PUT_BITS_FAST(match_len & mz_bitmasks[s_tdefl_len_extra[match_len]], s_tdefl_len_extra[match_len]);

            /* This sequence coaxes MSVC into using cmov's vs. jmp's. */
            s0 = s_tdefl_small_dist_sym[match_dist & 511];
            n0 = s_tdefl_small_dist_extra[match_dist & 511];
            s1 = s_tdefl_large_dist_sym[match_dist >> 8];
            n1 = s_tdefl_large_dist_extra[match_dist >> 8];
            sym = (match_dist < 512) ? s0 : s1;
            num_extra_bits = (match_dist < 512) ? n0 : n1;

            MZ_ASSERT(d->m_huff_code_sizes[1][sym]);
            TDEFL_PUT_BITS_FAST(d->m_huff_codes[1][sym], d->m_huff_code_sizes[1][sym]);
            TDEFL_PUT_BITS_FAST(match_dist & mz_bitmasks[num_extra_bits], num_extra_bits);
        }
        else
        {
            mz_uint lit = *pLZ_codes++;
            MZ_ASSERT(d->m_huff_code_sizes[0][lit]);
            TDEFL_PUT_BITS_FAST(d->m_huff_codes[0][lit], d->m_huff_code_sizes[0][lit]);

            if (((flags & 2) == 0) && (pLZ_codes < pLZ_code_buf_end))
            {
                flags >>= 1;
                lit = *pLZ_codes++;
                MZ_ASSERT(d->m_huff_code_sizes[0][lit]);
                TDEFL_PUT_BITS_FAST(d->m_huff_codes[0][lit], d->m_huff_code_sizes[0][lit]);

                if (((flags & 2) == 0) && (pLZ_codes < pLZ_code_buf_end))
                {
                    flags >>= 1;
                    lit = *pLZ_codes++;
                    MZ_ASSERT(d->m_huff_code_sizes[0][lit]);
                    TDEFL_PUT_BITS_FAST(d->m_huff_codes[0][lit], d->m_huff_code_sizes[0][lit]);
                }
            }
        }

        if (pOutput_buf >= d->m_pOutput_buf_end)
            return MZ_FALSE;

        *(mz_uint64 *)pOutput_buf = bit_buffer;
        pOutput_buf += (bits_in >> 3);
        bit_buffer >>= (bits_in & ~7);
        bits_in &= 7;
    }

#undef TDEFL_PUT_BITS_FAST

    d->m_pOutput_buf = pOutput_buf;
    d->m_bits_in = 0;
    d->m_bit_buffer = 0;

    while (bits_in)
    {
        mz_uint32 n = MZ_MIN(bits_in, 16);
        TDEFL_PUT_BITS((mz_uint)bit_buffer & mz_bitmasks[n], n);
        bit_buffer >>= n;
        bits_in -= n;
    }

    TDEFL_PUT_BITS(d->m_huff_codes[0][256], d->m_huff_code_sizes[0][256]);

    return (d->m_pOutput_buf < d->m_pOutput_buf_end);
}